

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O0

void formatJSON(string *filename,int indent)

{
  string *path;
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  Stringifier local_180;
  string str;
  undefined1 local_15c [8];
  Stringifier stringifier;
  JSON local_148 [32];
  undefined1 local_128 [8];
  Parser parser;
  clock_t start;
  int indent_local;
  string *filename_local;
  
  cVar1 = clock();
  path = (string *)
         &parser.ast.children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  JSON::resolvePath(path);
  std::__cxx11::string::operator=((string *)filename,(string *)path);
  std::__cxx11::string::~string((string *)path);
  JSON::readFile(local_148,filename);
  JSON::Parser::Parser((Parser *)local_128,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  JSON::Stringifier::Stringifier((Stringifier *)local_15c);
  JSON::Parser::parse((Parser *)local_128);
  JSON::Stringifier::stringify_abi_cxx11_(&local_180,(Node *)local_15c,(int)&parser + 0x80);
  JSON::writeFile(filename,(string *)&local_180);
  poVar2 = std::operator<<((ostream *)&std::cout,"Complete! Cost: ");
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar3 - cVar1) / 1000000.0);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_180);
  JSON::Parser::~Parser((Parser *)local_128);
  return;
}

Assistant:

void formatJSON(string filename, int indent) {
    clock_t start = clock();
    filename = JSON::resolvePath(filename);
    JSON::Parser parser(JSON::readFile(filename));
    JSON::Stringifier stringifier;
    parser.parse();
    string str = stringifier.stringify(parser.ast, indent);
    JSON::writeFile(filename, str);
    cout << "Complete! Cost: " << (double) (clock() - start) / CLOCKS_PER_SEC << "s" << endl;
}